

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator*
          (TPZSkylMatrix<double> *__return_storage_ptr__,TPZSkylMatrix<double> *this,double value)

{
  double **ppdVar1;
  double *pdVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  int64_t col;
  long lVar6;
  
  TPZSkylMatrix(__return_storage_ptr__,this);
  lVar6 = 0;
  while( true ) {
    iVar3 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    if (CONCAT44(extraout_var,iVar3) <= lVar6) break;
    ppdVar1 = (this->fElem).fStore;
    lVar4 = (long)ppdVar1[lVar6 + 1] - (long)ppdVar1[lVar6] >> 3;
    pdVar2 = (__return_storage_ptr__->fElem).fStore[lVar6];
    if (lVar4 < 1) {
      lVar4 = 0;
    }
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
      pdVar2[lVar5] = pdVar2[lVar5] * value;
    }
    lVar6 = lVar6 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator*(const TVar value ) const
{
	auto res(*this);
	
	for ( int64_t col = 0; col < this->Dim(); col++ )
    {
		// Aloca nova coluna para o resultado.
		int64_t colsize = Size(col);
		// Efetua a SOMA.
		TVar *elemRes  = res.fElem[col];
		for ( int64_t i = 0; i < colsize; i++ )
			*elemRes++ *= value;
    }
	
	return res;
}